

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::_M_erase_bucket(hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
                  *this,size_type __n,_Node *__first,_Node *__last)

{
  _Node *p_Var1;
  _Node *p_Var2;
  
  p_Var2 = (this->_M_buckets).
           super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[__n];
  if (p_Var2 == __first) {
    _M_erase_bucket(this,__n,__last);
    return;
  }
  do {
    p_Var1 = p_Var2;
    p_Var2 = p_Var1->_M_next;
  } while (p_Var2 != __first);
  while (p_Var2 != __last) {
    p_Var1->_M_next = p_Var2->_M_next;
    operator_delete(p_Var2,0x10);
    p_Var2 = p_Var1->_M_next;
    this->_M_num_elements = this->_M_num_elements - 1;
  }
  return;
}

Assistant:

void hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>
  ::_M_erase_bucket(const size_type __n, _Node* __first, _Node* __last)
{
  _Node* __cur = _M_buckets[__n];
  if (__cur == __first)
    _M_erase_bucket(__n, __last);
  else {
    _Node* __next;
    for (__next = __cur->_M_next;
         __next != __first;
         __cur = __next, __next = __cur->_M_next)
      ;
    while (__next != __last) {
      __cur->_M_next = __next->_M_next;
      _M_delete_node(__next);
      __next = __cur->_M_next;
      --_M_num_elements;
    }
  }
}